

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O1

void env_arr_new(char *identifer,int line,long numElements,Environment *env)

{
  Record *pRVar1;
  Object *pOVar2;
  Object *pOVar3;
  Record **ppRVar4;
  long lVar5;
  long lVar6;
  
  pRVar1 = env_match(identifer,env);
  if (pRVar1 != (Record *)0x0) {
    if ((pRVar1->object).type == OBJECT_ARRAY) {
      lVar6 = (long)(pRVar1->object).field_1.literal.line;
      (pRVar1->object).field_1.literal.line = (int)numElements;
      pOVar2 = (Object *)realloc((pRVar1->object).field_1.arr.values,numElements << 6);
      (pRVar1->object).field_1.arr.values = pOVar2;
      lVar5 = numElements - lVar6;
      if (lVar5 == 0 || numElements < lVar6) {
        return;
      }
      lVar6 = lVar6 << 6;
      do {
        *(undefined4 *)((long)&((pRVar1->object).field_1.arr.values)->type + lVar6) = 0;
        lVar6 = lVar6 + 0x40;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
      return;
    }
    printf("\x1b[31m\n[Runtime Error] [Line:%d] Variable %s is already defined!\x1b[0m",line,
           identifer);
  }
  pOVar3 = (Object *)malloc(numElements << 6);
  pOVar2 = pOVar3;
  lVar5 = numElements;
  if (0 < numElements) {
    do {
      pOVar2->type = OBJECT_NULL;
      lVar5 = lVar5 + -1;
      pOVar2 = pOVar2 + 1;
    } while (lVar5 != 0);
  }
  pRVar1 = (Record *)malloc(0x50);
  pRVar1->name = identifer;
  (pRVar1->object).type = OBJECT_ARRAY;
  (pRVar1->object).field_1.instance = (Instance *)(numElements & 0xffffffff);
  (pRVar1->object).field_1.arr.values = pOVar3;
  pRVar1->next = (Record *)0x0;
  ppRVar4 = &env->rear;
  if (env->front != (Record *)0x0) {
    env = (Environment *)ppRVar4;
    ppRVar4 = &(*ppRVar4)->next;
  }
  *ppRVar4 = pRVar1;
  env->front = pRVar1;
  return;
}

Assistant:

void env_arr_new(char *identifer, int line, long numElements, Environment *env){
    Record *match = env_match(identifer, env);
    if(match != NULL && match->object.type != OBJECT_ARRAY)
        printf(runtime_error("Variable %s is already defined!"), line, identifer);
    else if(match != NULL){
        long bak = match->object.arr.count;
        match->object.arr.count = numElements;
        match->object.arr.values = (Object *)reallocate(match->object.arr.values, sizeof(Object)*numElements);
        while(bak < numElements){
            match->object.arr.values[bak].type = OBJECT_NULL;
            bak++;
        }
        return;
    }
    Object o;
    o.type = OBJECT_ARRAY;
    o.arr.count = numElements;
    o.arr.values = (Object *)mallocate(sizeof(Object) * numElements);
    long i = 0;
    while(i < numElements){
        o.arr.values[i].type = OBJECT_NULL;
        i++;
    }
    rec_new(identifer, o, env);
}